

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

int nn_trie_subscribe(nn_trie *self,uint8_t *data,size_t size)

{
  uint8_t *__src;
  byte bVar1;
  uint32_t uVar2;
  nn_trie_node *pnVar3;
  void *pvVar4;
  long lVar5;
  nn_trie_node *pnVar6;
  undefined4 *puVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  byte *pbVar12;
  uint uVar13;
  size_t sVar14;
  byte bVar15;
  uint uVar16;
  long lVar17;
  
  pnVar6 = self->root;
  do {
    if (pnVar6 == (nn_trie_node *)0x0) goto LAB_00127d4d;
    __src = pnVar6->prefix;
    bVar8 = pnVar6->prefix_len;
    uVar9 = (ulong)(uint)bVar8;
    if (bVar8 != 0) {
      uVar9 = 0;
      do {
        if (size == uVar9) {
          uVar9 = size & 0xffffffff;
          goto LAB_001279dc;
        }
        if (__src[uVar9] != data[uVar9]) goto LAB_001279dc;
        uVar9 = uVar9 + 1;
      } while ((uint)bVar8 != uVar9);
      uVar9 = (ulong)bVar8;
    }
LAB_001279dc:
    sVar14 = (size_t)(int)uVar9;
    pbVar12 = data + sVar14;
    lVar17 = size - sVar14;
    if ((int)uVar9 < (int)(uint)bVar8) {
      puVar7 = (undefined4 *)nn_alloc_(0x20);
      *(undefined4 **)&((nn_trie_node *)self)->refcount = puVar7;
      *puVar7 = 0;
      *(byte *)((long)puVar7 + 5) = (byte)uVar9;
      *(undefined1 *)(puVar7 + 1) = 1;
      memcpy((void *)((long)puVar7 + 6),__src,sVar14);
      *(uint8_t *)(*(long *)&((nn_trie_node *)self)->refcount + 0x10) = pnVar6->prefix[sVar14];
      bVar8 = ~(byte)uVar9 + pnVar6->prefix_len;
      pnVar6->prefix_len = bVar8;
      memmove(__src,__src + sVar14 + 1,(ulong)bVar8);
      pnVar6 = nn_node_compact(pnVar6);
      *(nn_trie_node **)(*(long *)&((nn_trie_node *)self)->refcount + 0x18) = pnVar6;
LAB_00127ab7:
      if (size == sVar14) goto LAB_00127e04;
      pvVar4 = *(void **)&((nn_trie_node *)self)->refcount;
      uVar9 = (ulong)*(byte *)((long)pvVar4 + 4);
      if (uVar9 < 8) {
        pvVar4 = nn_realloc(pvVar4,uVar9 * 8 + 0x20);
        *(void **)&((nn_trie_node *)self)->refcount = pvVar4;
        *(byte *)((long)pvVar4 + (ulong)*(byte *)((long)pvVar4 + 4) + 0x10) = *pbVar12;
        lVar5 = *(long *)&((nn_trie_node *)self)->refcount;
        bVar8 = *(char *)(lVar5 + 4) + 1;
        *(byte *)(lVar5 + 4) = bVar8;
        self = (nn_trie *)(lVar5 + 0x10 + (ulong)bVar8 * 8);
        ((nn_trie_node *)self)->refcount = 0;
        ((nn_trie_node *)self)->type = '\0';
        ((nn_trie_node *)self)->prefix_len = '\0';
        ((nn_trie_node *)self)->prefix[0] = '\0';
        ((nn_trie_node *)self)->prefix[1] = '\0';
      }
      else {
        if (*(byte *)((long)pvVar4 + 4) != 9) {
          bVar8 = 0xff;
          uVar11 = 0;
          bVar15 = 0;
          do {
            bVar1 = *(byte *)((long)pvVar4 + uVar11 + 0x10);
            if (bVar1 <= bVar8) {
              bVar8 = bVar1;
            }
            if (bVar1 < bVar15) {
              bVar1 = bVar15;
            }
            bVar15 = bVar1;
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
          bVar1 = *pbVar12;
          if (bVar1 <= bVar8) {
            bVar8 = bVar1;
          }
          if (bVar1 < bVar15) {
            bVar1 = bVar15;
          }
          lVar5 = (long)(int)((uint)bVar1 - (uint)bVar8);
          puVar7 = (undefined4 *)nn_alloc_(lVar5 * 8 + 0x20);
          *(undefined4 **)&((nn_trie_node *)self)->refcount = puVar7;
          *puVar7 = 0;
          *(undefined1 *)((long)puVar7 + 5) = *(undefined1 *)((long)pvVar4 + 5);
          *(undefined1 *)(puVar7 + 1) = 9;
          memcpy((void *)((long)puVar7 + 6),(void *)((long)pvVar4 + 6),
                 (ulong)*(byte *)((long)pvVar4 + 5));
          *(byte *)(*(long *)&((nn_trie_node *)self)->refcount + 0x10) = bVar8;
          *(byte *)(*(long *)&((nn_trie_node *)self)->refcount + 0x11) = bVar1;
          *(ushort *)(*(long *)&((nn_trie_node *)self)->refcount + 0x12) =
               *(byte *)((long)pvVar4 + 4) + 1;
          memset((void *)(*(long *)&((nn_trie_node *)self)->refcount + 0x18),0,lVar5 * 8 + 8);
          bVar15 = *(byte *)((long)pvVar4 + 4);
          if ((ulong)bVar15 != 0) {
            uVar9 = 0;
            do {
              *(undefined8 *)
               (*(long *)&((nn_trie_node *)self)->refcount +
               ((ulong)*(byte *)((long)pvVar4 + uVar9 + 0x10) - (ulong)(uint)bVar8) * 8 + 0x18) =
                   *(undefined8 *)((long)pvVar4 + uVar9 * 8 + 0x18);
              uVar9 = uVar9 + 1;
            } while (bVar15 != uVar9);
          }
          self = (nn_trie *)
                 nn_node_next(*(nn_trie_node **)&((nn_trie_node *)self)->refcount,*pbVar12);
          data = pbVar12 + 1;
          size = lVar17 - 1;
          nn_free(pvVar4);
LAB_00127d4d:
          pnVar6 = (nn_trie_node *)nn_alloc_((ulong)(10 < size) * 8 + 0x18);
          *self = (nn_trie)pnVar6;
          pnVar6->refcount = 0;
          pnVar6->type = 10 < size;
          sVar14 = 10;
          if (size < 10) {
            sVar14 = size;
          }
          pnVar6->prefix_len = (uint8_t)sVar14;
          memcpy(pnVar6->prefix,data,sVar14);
          while (10 < size) {
            uVar9 = (ulong)self->root->prefix_len;
            pbVar12 = data + uVar9;
            data = pbVar12 + 1;
            (self->root->u).sparse.children[0] = *pbVar12;
            pnVar6 = self->root;
            size = size + ~uVar9;
            puVar7 = (undefined4 *)nn_alloc_((ulong)(10 < size) * 8 + 0x18);
            *(undefined4 **)(pnVar6 + 1) = puVar7;
            *(bool *)(puVar7 + 1) = 10 < size;
            self = (nn_trie *)(pnVar6 + 1);
            *puVar7 = 0;
            sVar14 = 10;
            if (size < 10) {
              sVar14 = size;
            }
            *(char *)((long)puVar7 + 5) = (char)sVar14;
            memcpy((void *)((long)puVar7 + 6),data,sVar14);
          }
LAB_00127e04:
          uVar2 = (*(nn_trie_node **)&((nn_trie_node *)self)->refcount)->refcount;
          (*(nn_trie_node **)&((nn_trie_node *)self)->refcount)->refcount = uVar2 + 1;
          return (int)(uVar2 == 0);
        }
        bVar8 = *pbVar12;
        bVar15 = *(byte *)((long)pvVar4 + 0x10);
        if ((bVar8 < bVar15) || (*(byte *)((long)pvVar4 + 0x11) < bVar8)) {
          uVar13 = (uint)bVar15;
          if (bVar8 <= bVar15) {
            uVar13 = (uint)bVar8;
          }
          uVar16 = (uint)*(byte *)((long)pvVar4 + 0x11);
          if (*(byte *)((long)pvVar4 + 0x11) <= bVar8) {
            uVar16 = (uint)bVar8;
          }
          pvVar4 = nn_realloc(pvVar4,(long)(int)(uVar16 - uVar13) * 8 + 0x20);
          *(void **)&((nn_trie_node *)self)->refcount = pvVar4;
          bVar15 = *(byte *)((long)pvVar4 + 0x10);
          lVar10 = (ulong)*(byte *)((long)pvVar4 + 0x11) - (ulong)bVar15;
          lVar5 = lVar10 + 1;
          if (bVar15 == (byte)uVar13) {
            pvVar4 = (void *)((long)pvVar4 + (long)(int)lVar5 * 8);
            lVar10 = (long)(int)((uVar16 - uVar13) - (int)lVar10);
          }
          else {
            lVar10 = (long)(int)(bVar15 - uVar13);
            memmove((void *)((long)pvVar4 + lVar10 * 8 + 0x18),(void *)((long)pvVar4 + 0x18),
                    lVar5 * 8);
            pvVar4 = *(void **)&((nn_trie_node *)self)->refcount;
          }
          memset((void *)((long)pvVar4 + 0x18),0,lVar10 << 3);
          *(byte *)(*(long *)&((nn_trie_node *)self)->refcount + 0x10) = (byte)uVar13;
          *(char *)(*(long *)&((nn_trie_node *)self)->refcount + 0x11) = (char)uVar16;
        }
        lVar5 = *(long *)&((nn_trie_node *)self)->refcount + 0x12;
        *(short *)lVar5 = *(short *)lVar5 + 1;
        self = (nn_trie *)
               (*(long *)&((nn_trie_node *)self)->refcount +
               ((ulong)bVar8 - (ulong)*(byte *)(*(long *)&((nn_trie_node *)self)->refcount + 0x10))
               * 8 + 0x18);
      }
      data = pbVar12 + 1;
      size = lVar17 - 1;
      goto LAB_00127d4d;
    }
    if (size == sVar14) goto LAB_00127e04;
    pnVar3 = (nn_trie_node *)nn_node_next(pnVar6,*pbVar12);
    if ((pnVar3 == (nn_trie_node *)0x0) || (*(nn_trie_node **)pnVar3 == (nn_trie_node *)0x0))
    goto LAB_00127ab7;
    data = pbVar12 + 1;
    size = lVar17 - 1;
    pnVar6 = *(nn_trie_node **)pnVar3;
    self = (nn_trie *)pnVar3;
  } while( true );
}

Assistant:

int nn_trie_subscribe (struct nn_trie *self, const uint8_t *data, size_t size)
{
    int i;
    struct nn_trie_node **node;
    struct nn_trie_node **n;
    struct nn_trie_node *ch;
    struct nn_trie_node *old_node;
    int pos;
    uint8_t c;
    uint8_t c2;
    uint8_t new_min;
    uint8_t new_max;
    int old_children;
    int new_children;
    int inserted;
    int more_nodes;

    /*  Step 1 -- Traverse the trie. */

    node = &self->root;
    while (1) {

        /*  If there are no more nodes on the path, go to step 4. */
        if (!*node)
            goto step4;

        /*  Check whether prefix matches the new subscription. */
        pos = nn_node_check_prefix (*node, data, size);
        data += pos;
        size -= pos;

        /*  If only part of the prefix matches, go to step 2. */
        if (pos < (*node)->prefix_len)
            goto step2;

        /*  Even if whole prefix matches and there's no more data to match,
            go directly to step 5. */
        if (!size)
            goto step5;

        /*  Move to the next node. If it is not present, go to step 3. */
        n = nn_node_next (*node, *data);
        if (!n || !*n)
            goto step3;
        node = n;
        ++data;
        --size;
    }

    /*  Step 2 -- Split the prefix into two parts if required. */
step2:

    ch = *node;
    *node = nn_alloc (sizeof (struct nn_trie_node) +
        sizeof (struct nn_trie_node*), "trie node");
    assert (*node);
    (*node)->refcount = 0;
    (*node)->prefix_len = pos;
    (*node)->type = 1;
    memcpy ((*node)->prefix, ch->prefix, pos);
    (*node)->u.sparse.children [0] = ch->prefix [pos];
    ch->prefix_len -= (pos + 1);
    memmove (ch->prefix, ch->prefix + pos + 1, ch->prefix_len);
    ch = nn_node_compact (ch);
    *nn_node_child (*node, 0) = ch;

    /*  Step 3 -- Adjust the child array to accommodate the new character. */
step3:

    /*  If there are no more data in the subscription, there's nothing to
        adjust in the child array. Proceed directly to the step 5. */
    if (!size)
        goto step5;

    /*  If the new branch fits into sparse array... */
    if ((*node)->type < NN_TRIE_SPARSE_MAX) {
        *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
            ((*node)->type + 1) * sizeof (struct nn_trie_node*));
        assert (*node);
        (*node)->u.sparse.children [(*node)->type] = *data;
        ++(*node)->type;
        node = nn_node_child (*node, (*node)->type - 1);
        *node = NULL;
        ++data;
        --size;
        goto step4;
    }

    /*  If the node is already a dense array, resize it to fit the next
        character. */
    if ((*node)->type == NN_TRIE_DENSE_TYPE) {
        c = *data;
        if (c < (*node)->u.dense.min || c > (*node)->u.dense.max) {
            new_min = (*node)->u.dense.min < c ? (*node)->u.dense.min : c;
            new_max = (*node)->u.dense.max > c ? (*node)->u.dense.max : c;
            *node = nn_realloc (*node, sizeof (struct nn_trie_node) +
                (new_max - new_min + 1) * sizeof (struct nn_trie_node*));
            assert (*node);
            old_children = (*node)->u.dense.max - (*node)->u.dense.min + 1;
            new_children = new_max - new_min + 1;
            if ((*node)->u.dense.min != new_min) {
                inserted = (*node)->u.dense.min - new_min;
                memmove (nn_node_child (*node, inserted),
                    nn_node_child (*node, 0),
                    old_children * sizeof (struct nn_trie_node*));
                memset (nn_node_child (*node, 0), 0,
                    inserted * sizeof (struct nn_trie_node*));
            }
            else {
                memset (nn_node_child (*node, old_children), 0,
                    (new_children - old_children) *
                    sizeof (struct nn_trie_node*));
            }
            (*node)->u.dense.min = new_min;
            (*node)->u.dense.max = new_max;
        }
        ++(*node)->u.dense.nbr;

        node = nn_node_child (*node, c - (*node)->u.dense.min);
        ++data;
        --size;
        goto step4;
    }

    /*  This is a sparse array, but no more children can be added to it.
        We have to convert it into a dense array. */
    {
        /*  First, determine the range of children. */
        new_min = 255;
        new_max = 0;
        for (i = 0; i != (*node)->type; ++i) {
            c2 = (*node)->u.sparse.children [i];
            new_min = new_min < c2 ? new_min : c2;
            new_max = new_max > c2 ? new_max : c2;
        }
        new_min = new_min < *data ? new_min : *data;
        new_max = new_max > *data ? new_max : *data;

        /*  Create a new mode, while keeping the old one for a while. */
        old_node = *node;
        *node = (struct nn_trie_node*) nn_alloc (sizeof (struct nn_trie_node) +
            (new_max - new_min + 1) * sizeof (struct nn_trie_node*),
            "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->prefix_len = old_node->prefix_len;
        (*node)->type = NN_TRIE_DENSE_TYPE;
        memcpy ((*node)->prefix, old_node->prefix, old_node->prefix_len);
        (*node)->u.dense.min = new_min;
        (*node)->u.dense.max = new_max;
        (*node)->u.dense.nbr = old_node->type + 1;
        memset (*node + 1, 0, (new_max - new_min + 1) *
            sizeof (struct nn_trie_node*));
        for (i = 0; i != old_node->type; ++i)
            *nn_node_child (*node, old_node->u.sparse.children [i] - new_min) =
                *nn_node_child (old_node, i);
        node = nn_node_next (*node, *data);
        ++data;
        --size;

        /*  Get rid of the obsolete old node. */
        nn_free (old_node);
    }

    /*  Step 4 -- Create new nodes for remaining part of the subscription. */
step4:

    assert (!*node);
    while (1) {

        /*  Create a new node to hold the next part of the subscription. */
        more_nodes = size > NN_TRIE_PREFIX_MAX;
        *node = nn_alloc (sizeof (struct nn_trie_node) +
            (more_nodes ? sizeof (struct nn_trie_node*) : 0), "trie node");
        assert (*node);

        /*  Fill in the new node. */
        (*node)->refcount = 0;
        (*node)->type = more_nodes ? 1 : 0;
        (*node)->prefix_len = size < (uint8_t) NN_TRIE_PREFIX_MAX ?
            (uint8_t) size : (uint8_t) NN_TRIE_PREFIX_MAX;
        memcpy ((*node)->prefix, data, (*node)->prefix_len);
        data += (*node)->prefix_len;
        size -= (*node)->prefix_len;
        if (!more_nodes)
            break;
        (*node)->u.sparse.children [0] = *data;
        node = nn_node_child (*node, 0);
        ++data;
        --size;
    }

    /*  Step 5 -- Create the subscription as such. */
step5:

    ++(*node)->refcount;

    /*  Return 1 in case of a fresh subscription. */
    return (*node)->refcount == 1 ? 1 : 0;
}